

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void destroy_ship_proc(Am_Object *command_obj,Am_Object param_2,Am_Inter_Location *data)

{
  char cVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object *this;
  bool flag;
  Am_Object obj_over;
  int y2;
  int x2;
  Am_Object source_ship;
  Am_Object inter;
  Am_Object ref_obj;
  int y1;
  int x1;
  undefined1 local_49 [9];
  uint local_40;
  int local_3c;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  int local_10;
  int local_c;
  
  local_28.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location
            ((bool *)data,(Am_Object *)local_49,(int *)&local_28,&local_c,&local_10,&local_3c);
  cVar1 = Am_Object::operator!=(&local_28,&SP_Ship_Agg);
  if (cVar1 != '\0') {
    Am_Translate_Coordinates(&local_28,local_3c,local_40,&SP_Ship_Agg,&local_3c,(int *)&local_40);
  }
  Am_Point_In_Part((Am_Object *)(local_49 + 1),0x10e3f0,local_3c,(Am_Object *)(ulong)local_40,true,
                   false);
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    Am_Object::Get_Object((ushort)&local_30,(ulong)command_obj);
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x11a);
    Am_Object::Am_Object(&local_38,pAVar2);
    cVar1 = Am_Object::operator!=((Am_Object *)(local_49 + 1),&local_38);
    if (cVar1 != '\0') {
      Am_Object::Am_Object(&local_18,(Am_Object *)(local_49 + 1));
      hide_ship(&local_18);
      Am_Object::~Am_Object(&local_18);
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)(local_49 + 1));
      Am_Object::Set((ushort)command_obj,(Am_Wrapper *)0x169,(ulong)pAVar3);
      Am_Object::~Am_Object(&local_38);
      this = &local_30;
      goto LAB_00106ed9;
    }
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_30);
  }
  Am_Object::Am_Object(&local_20,command_obj);
  Am_Abort_Widget((Am_Object_Data *)&local_20);
  this = &local_20;
LAB_00106ed9:
  Am_Object::~Am_Object(this);
  Am_Object::~Am_Object((Am_Object *)(local_49 + 1));
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Current_Location_Method, void, destroy_ship,
                 (Am_Object command_obj, Am_Object /* obj_modified */,
                  Am_Inter_Location data))
{
  // We use the second endpoint of the phaser beam to determine the location
  // of the ship to destroy.
  Am_Object ref_obj;
  int x1, y1, x2, y2;
  bool flag;
  // the phaser is from (x1, y1) to (x2, y2) wrt ref_obj.
  data.Get_Location(flag, ref_obj, x1, y1, x2, y2);
  if (ref_obj != SP_Ship_Agg)
    Am_Translate_Coordinates(ref_obj, x2, y2, SP_Ship_Agg, x2, y2);

  Am_Object obj_over = Am_Point_In_Part(SP_Ship_Agg, x2, y2, SP_Ship_Agg);
  if (obj_over.Valid()) {
    // Don't allow a ship to destroy itself.
    // get object the interactor started over, which will be the source ship
    Am_Object inter = command_obj.Get_Owner();
    Am_Object source_ship = inter.Get(Am_START_OBJECT);
    if (obj_over != source_ship) {
      // destroy_tractor_beams (obj_over);
      // obj_over.Destroy();
      hide_ship(obj_over);
      command_obj.Set(Am_VALUE, obj_over);
      return; //everything is fine
    }
  }
  // if get here, then nothing destroyed
  Am_Abort_Widget(command_obj); //make this not be queued for undo
}